

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3_reset(drmp3 *pMP3)

{
  code *pcVar1;
  SDL_AssertState SVar2;
  SDL_AssertState sdl_assert_state;
  drmp3 *pMP3_local;
  
  do {
    if (pMP3 != (drmp3 *)0x0) goto LAB_00129704;
    SVar2 = (*SDL20_ReportAssertion)
                      (&drmp3_reset::sdl_assert_data,"drmp3_reset",
                       "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/dr_mp3.h"
                       ,0xec8);
  } while (SVar2 == SDL_ASSERTION_RETRY);
  if (SVar2 == SDL_ASSERTION_BREAK) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
LAB_00129704:
  pMP3->pcmFramesConsumedInMP3Frame = 0;
  pMP3->pcmFramesRemainingInMP3Frame = 0;
  pMP3->currentPCMFrame = 0;
  pMP3->dataSize = 0;
  pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
  drmp3dec_init(&pMP3->decoder);
  return;
}

Assistant:

static void drmp3_reset(drmp3* pMP3)
{
    DRMP3_ASSERT(pMP3 != NULL);

    pMP3->pcmFramesConsumedInMP3Frame = 0;
    pMP3->pcmFramesRemainingInMP3Frame = 0;
    pMP3->currentPCMFrame = 0;
    pMP3->dataSize = 0;
    pMP3->atEnd = DRMP3_FALSE;
    drmp3dec_init(&pMP3->decoder);
}